

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_compile(HSQUIRRELVM v,SQChar *s,SQInteger size,SQChar *sourcename,SQBool raiseerror,
                   HSQOBJECT *bindings)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQRESULT SVar3;
  SQObjectPtr o;
  SQObjectPtr local_20;
  
  o.super_SQObject._unVal.pTable = (SQTable *)0x0;
  o.super_SQObject._type = OT_NULL;
  o.super_SQObject._flags = '\0';
  o.super_SQObject._5_3_ = 0;
  bVar2 = SQCompilation::Compile
                    (v,s,size,bindings,sourcename,&o,raiseerror != 0,v->_sharedstate->_debuginfo);
  SVar3 = -1;
  if (bVar2) {
    local_20.super_SQObject._unVal.pClosure =
         SQClosure::Create(v->_sharedstate,o.super_SQObject._unVal.pFunctionProto);
    local_20.super_SQObject._type = OT_CLOSURE;
    local_20.super_SQObject._flags = '\0';
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_20);
    SQObjectPtr::~SQObjectPtr(&local_20);
    SVar3 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&o);
  return SVar3;
}

Assistant:

SQRESULT sq_compile(HSQUIRRELVM v, const SQChar *s, SQInteger size, const SQChar *sourcename,SQBool raiseerror,const HSQOBJECT *bindings)
{
    SQObjectPtr o;
#ifndef NO_COMPILER
    if(Compile(v, s, size, bindings, sourcename, o, raiseerror?true:false, _ss(v)->_debuginfo)) {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o)));
        return SQ_OK;
    }
    return SQ_ERROR;
#else
    return sq_throwerror(v,_SC("this is a no compiler build"));
#endif
}